

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O0

lys_node * lyd_new_find_schema(lyd_node *parent,lys_module *module,int rpc_output)

{
  LYS_NODE LVar1;
  lys_node *local_30;
  lys_node *siblings;
  int rpc_output_local;
  lys_module *module_local;
  lyd_node *parent_local;
  
  if (parent == (lyd_node *)0x0) {
    local_30 = module->data;
  }
  else {
    if (parent->schema == (lys_node *)0x0) {
      return (lys_node *)0x0;
    }
    local_30 = parent->schema->child;
    if (local_30 != (lys_node *)0x0) {
      LVar1 = LYS_OUTPUT;
      if (rpc_output != 0) {
        LVar1 = LYS_INPUT;
      }
      if (local_30->nodetype == LVar1) {
        local_30 = local_30->next;
      }
    }
    if (local_30 != (lys_node *)0x0) {
      LVar1 = LYS_INPUT;
      if (rpc_output != 0) {
        LVar1 = LYS_OUTPUT;
      }
      if (local_30->nodetype == LVar1) {
        local_30 = local_30->child;
      }
    }
  }
  return local_30;
}

Assistant:

static struct lys_node *
lyd_new_find_schema(struct lyd_node *parent, const struct lys_module *module, int rpc_output)
{
    struct lys_node *siblings;

    if (!parent) {
        siblings = module->data;
    } else {
        if (!parent->schema) {
            return NULL;
        }
        siblings = parent->schema->child;
        if (siblings && (siblings->nodetype == (rpc_output ? LYS_INPUT : LYS_OUTPUT))) {
            siblings = siblings->next;
        }
        if (siblings && (siblings->nodetype == (rpc_output ? LYS_OUTPUT : LYS_INPUT))) {
            siblings = siblings->child;
        }
    }

    return siblings;
}